

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O1

png_fixed_point png_get_x_offset_inches_fixed(png_const_structrp png_ptr,png_const_inforp info_ptr)

{
  png_fixed_point pVar1;
  int iVar2;
  png_fixed_point pStack_c;
  
  if (((info_ptr != (png_const_inforp)0x0 && png_ptr != (png_const_structrp)0x0) &&
      ((info_ptr->valid & 0x100) != 0)) && (info_ptr->offset_unit_type == '\x01')) {
    pVar1 = png_fixed_inches_from_microns(png_ptr,info_ptr->x_offset);
    return pVar1;
  }
  iVar2 = png_muldiv(&pStack_c,0,500,0x7f);
  if (iVar2 == 0) {
    png_warning(png_ptr,"fixed point overflow ignored");
    pStack_c = 0;
  }
  return pStack_c;
}

Assistant:

png_fixed_point PNGAPI
png_get_x_offset_inches_fixed(png_const_structrp png_ptr,
    png_const_inforp info_ptr)
{
   return png_fixed_inches_from_microns(png_ptr,
       png_get_x_offset_microns(png_ptr, info_ptr));
}